

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

int32_t delta_from_arg_vals(rtosc_arg_val_t *llhsarg,rtosc_arg_val_t *lhsarg,rtosc_arg_val_t *rhsarg
                           ,rtosc_arg_val_t *delta,int must_be_unity)

{
  int iVar1;
  int res;
  rtosc_cmp_options cmp_options;
  rtosc_arg_val_t div;
  rtosc_arg_val_t null_val;
  rtosc_arg_val_t width2;
  
  if (must_be_unity == 0) {
    rtosc_arg_val_sub(lhsarg,llhsarg,delta);
    rtosc_arg_val_null(&null_val,delta->type);
    iVar1 = rtosc_arg_vals_cmp(delta,&null_val,1,1,(rtosc_cmp_options *)0x0);
  }
  else {
    iVar1 = rtosc_arg_vals_cmp(lhsarg,rhsarg,1,1,(rtosc_cmp_options *)0x0);
    rtosc_arg_val_from_int(delta,rhsarg->type,1);
    if (0 < iVar1) {
      rtosc_arg_val_negate(delta);
      goto LAB_0010d2ad;
    }
  }
  if (iVar1 == 0) {
    return -1;
  }
  if (rhsarg == (rtosc_arg_val_t *)0x0) {
    return 0;
  }
LAB_0010d2ad:
  rtosc_arg_val_sub(rhsarg,lhsarg,&null_val);
  rtosc_arg_val_div(&null_val,delta,&div);
  rtosc_arg_val_round(&div);
  rtosc_arg_val_mult(&div,delta,&width2);
  cmp_options.float_tolerance = 0.001;
  iVar1 = rtosc_arg_vals_eq(&null_val,&width2,1,1,&cmp_options);
  if (iVar1 == 0) {
    return -1;
  }
  rtosc_arg_val_to_int(&div,&res);
  return res + 1;
}

Assistant:

int32_t delta_from_arg_vals(const rtosc_arg_val_t* llhsarg,
                            const rtosc_arg_val_t* lhsarg,
                            const rtosc_arg_val_t* rhsarg,
                            rtosc_arg_val_t* delta,
                            int must_be_unity)
{
    /*
        compute delta
    */
    int cmp;
    if(must_be_unity)
    {
        cmp = rtosc_arg_vals_cmp(lhsarg, rhsarg, 1, 1, NULL);
        rtosc_arg_val_from_int(delta, rhsarg->type, 1);
        if(cmp > 0)
            rtosc_arg_val_negate(delta);
    }
    else
    {
        rtosc_arg_val_sub(lhsarg, llhsarg, delta);
        rtosc_arg_val_t null_val;
        rtosc_arg_val_null(&null_val, delta->type);
        cmp = rtosc_arg_vals_cmp(delta, &null_val, 1, 1, NULL);
    }

    if(!cmp)
        return -1;

    /*
     * check if delta matches,
     * i.e. there's an "n" s. t. lhsarg + n*delta = rhsarg
     */
    int res;
    if(rhsarg)
    {
        rtosc_arg_val_t width, div, width2;
        rtosc_arg_val_sub(rhsarg, lhsarg, &width);
        rtosc_arg_val_div(&width, delta, &div);
        rtosc_arg_val_round(&div);
        rtosc_arg_val_mult(&div, delta, &width2);

        const rtosc_cmp_options cmp_options
         = ((rtosc_cmp_options) { 0.001 });
        if( ! rtosc_arg_vals_eq(&width, &width2, 1, 1, &cmp_options))
            return -1;

        rtosc_arg_val_to_int(&div, &res);
    }
    else
        res = -1; // return 0 to say "infinite range"
    return res + 1;
}